

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpke.cc
# Opt level: O3

int EVP_HPKE_KEY_private_key(EVP_HPKE_KEY *key,uint8_t *out,size_t *out_len,size_t max_out)

{
  ulong __n;
  size_t sVar1;
  int iVar2;
  
  __n = key->kem->private_key_len;
  if (max_out < __n) {
    iVar2 = 0;
    ERR_put_error(6,0,0x89,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hpke/hpke.cc"
                  ,0x2b8);
  }
  else {
    if (__n == 0) {
      sVar1 = 0;
    }
    else {
      memcpy(out,key->private_key,__n);
      sVar1 = key->kem->private_key_len;
    }
    *out_len = sVar1;
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int EVP_HPKE_KEY_private_key(const EVP_HPKE_KEY *key, uint8_t *out,
                             size_t *out_len, size_t max_out) {
  if (max_out < key->kem->private_key_len) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_INVALID_BUFFER_SIZE);
    return 0;
  }
  OPENSSL_memcpy(out, key->private_key, key->kem->private_key_len);
  *out_len = key->kem->private_key_len;
  return 1;
}